

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

CoinsCacheSizeState __thiscall
Chainstate::GetCoinsCacheSizeState
          (Chainstate *this,size_t max_coins_cache_size_bytes,size_t max_mempool_size_bytes)

{
  CoinsCacheSizeState CVar1;
  size_t sVar2;
  CCoinsViewCache *this_00;
  long *plVar3;
  long lVar4;
  long *plVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  int64_t nTotalSpace;
  int64_t cacheSize;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_mempool == (CTxMemPool *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = CTxMemPool::DynamicMemoryUsage(this->m_mempool);
  }
  this_00 = CoinsTip(this);
  cacheSize = CCoinsViewCache::DynamicMemoryUsage(this_00);
  lVar4 = 0;
  if (0 < (long)(max_mempool_size_bytes - sVar2)) {
    lVar4 = max_mempool_size_bytes - sVar2;
  }
  nTotalSpace = lVar4 + max_coins_cache_size_bytes;
  if (nTotalSpace < cacheSize) {
    logging_function._M_str = "GetCoinsCacheSizeState";
    logging_function._M_len = 0x16;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    LogPrintf_<long,long>
              (logging_function,source_file,0xad4,
               I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|ADDRMAN|ESTIMATEFEE|WALLETDB|BENCH|HTTP|TOR
               ,(Level)&cacheSize,(char *)&nTotalSpace,(long *)nTotalSpace,(long *)cacheSize);
    CVar1 = CRITICAL;
  }
  else {
    plVar3 = (long *)((nTotalSpace * 9) / 10);
    plVar5 = (long *)(nTotalSpace + -0xa00000);
    if ((long)(nTotalSpace + -0xa00000) < (long)plVar3) {
      plVar5 = plVar3;
    }
    CVar1 = (CoinsCacheSizeState)((long)plVar5 < cacheSize);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return CVar1;
  }
  __stack_chk_fail();
}

Assistant:

CoinsCacheSizeState Chainstate::GetCoinsCacheSizeState(
    size_t max_coins_cache_size_bytes,
    size_t max_mempool_size_bytes)
{
    AssertLockHeld(::cs_main);
    const int64_t nMempoolUsage = m_mempool ? m_mempool->DynamicMemoryUsage() : 0;
    int64_t cacheSize = CoinsTip().DynamicMemoryUsage();
    int64_t nTotalSpace =
        max_coins_cache_size_bytes + std::max<int64_t>(int64_t(max_mempool_size_bytes) - nMempoolUsage, 0);

    //! No need to periodic flush if at least this much space still available.
    static constexpr int64_t MAX_BLOCK_COINSDB_USAGE_BYTES = 10 * 1024 * 1024;  // 10MB
    int64_t large_threshold =
        std::max((9 * nTotalSpace) / 10, nTotalSpace - MAX_BLOCK_COINSDB_USAGE_BYTES);

    if (cacheSize > nTotalSpace) {
        LogPrintf("Cache size (%s) exceeds total space (%s)\n", cacheSize, nTotalSpace);
        return CoinsCacheSizeState::CRITICAL;
    } else if (cacheSize > large_threshold) {
        return CoinsCacheSizeState::LARGE;
    }
    return CoinsCacheSizeState::OK;
}